

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall
Operations::DoActualRegen
          (Operations *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,bool dryRun)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  pointer pbVar1;
  bool writeToStdout;
  char *pcVar2;
  iterator iVar3;
  mapped_type *ppCVar4;
  ostream *poVar5;
  pointer arg;
  __node_base *p_Var6;
  string target;
  string local_50;
  
  LoadProject(this,false);
  boost::filesystem::current_path(&this->projectRoot);
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if (__lhs == (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
    p_Var6 = &(this->components)._M_h._M_before_begin;
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      RegenerateCmakeFilesForComponent(&this->config,(Component *)p_Var6[5]._M_nxt,dryRun,false);
    }
  }
  else {
    writeToStdout = std::operator==(__lhs,"-");
    if (writeToStdout) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(args,(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start);
      dryRun = true;
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (arg = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; arg != pbVar1; arg = arg + 1) {
      targetFrom(&local_50,arg);
      p_Var6 = &(this->components)._M_h._M_before_begin;
      if (this->recursive == true) {
        while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
          pcVar2 = strstr((char *)p_Var6[1]._M_nxt,local_50._M_dataplus._M_p);
          if (pcVar2 != (char *)0x0) {
            RegenerateCmakeFilesForComponent
                      (&this->config,(Component *)p_Var6[5]._M_nxt,dryRun,writeToStdout);
          }
        }
      }
      else {
        iVar3 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->components)._M_h,&local_50);
        if (iVar3.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_true>
            ._M_cur == (__node_type *)0x0) {
          poVar5 = std::operator<<((ostream *)&std::cout,"Target \'");
          poVar5 = std::operator<<(poVar5,(string *)&local_50);
          std::operator<<(poVar5,"\' not found\n");
        }
        else {
          ppCVar4 = std::__detail::
                    _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&this->components,&local_50);
          RegenerateCmakeFilesForComponent(&this->config,*ppCVar4,dryRun,writeToStdout);
        }
      }
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void DoActualRegen(std::vector<std::string> args, bool dryRun) {
        LoadProject();
        filesystem::current_path(projectRoot);
        if (args.empty()) {
            for (auto &c : components) {
                RegenerateCmakeFilesForComponent(config, c.second, dryRun, false);
            }
        } else {
            bool writeToStdoutInstead = false;
            if (args[0] == "-") {
                dryRun = true; // Can't rewrite actual CMakeFiles if you asked them to be sent to stdout.
                writeToStdoutInstead = true;
                args.erase(args.begin());
            }
            for (auto& s : args) {
                const std::string target = targetFrom(s);
                if (recursive) {
                    for (auto& c : components) {
                        if (strstr(c.first.c_str(), target.c_str())) {
                            RegenerateCmakeFilesForComponent(config, c.second, dryRun, writeToStdoutInstead);
                        }
                    }
                } else {
                    if (components.find(target) != components.end()) {
                        RegenerateCmakeFilesForComponent(config, components[target], dryRun, writeToStdoutInstead);
                    } else {
                        std::cout << "Target '" << target << "' not found\n";
                    }
                }
            }
        }
    }